

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

int smf_track_add_eot_delta_pulses(smf_track_t *track,int delta)

{
  smf_event_t *event_00;
  smf_event_t *event;
  int delta_local;
  smf_track_t *track_local;
  
  event_00 = smf_event_new_from_bytes(0xff,0x2f,0);
  if (event_00 == (smf_event_t *)0x0) {
    track_local._4_4_ = -1;
  }
  else {
    smf_track_add_event_delta_pulses(track,event_00,delta);
    track_local._4_4_ = 0;
  }
  return track_local._4_4_;
}

Assistant:

int
smf_track_add_eot_delta_pulses(smf_track_t *track, int delta)
{
	smf_event_t *event;

	event = smf_event_new_from_bytes(0xFF, 0x2F, 0x00);
	if (event == NULL)
		return (-1);

	smf_track_add_event_delta_pulses(track, event, delta);

	return (0);
}